

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# componententity.cpp
# Opt level: O0

ComponentPtr __thiscall
libcellml::ComponentEntity::takeComponent(ComponentEntity *this,size_t index)

{
  ulong uVar1;
  ComponentEntityImpl *pCVar2;
  size_type sVar3;
  reference pvVar4;
  ComponentEntityImpl *pCVar5;
  element_type *this_00;
  ComponentImpl *this_01;
  ulong in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  ComponentPtr CVar7;
  __normal_iterator<std::shared_ptr<libcellml::Component>_*,_std::vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>_>
  local_50;
  __normal_iterator<std::shared_ptr<libcellml::Component>_*,_std::vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>_>
  local_48;
  const_iterator local_40;
  undefined1 local_21;
  ulong local_20;
  size_t index_local;
  ComponentEntity *this_local;
  ComponentPtr *component;
  
  local_21 = 0;
  local_20 = in_RDX;
  index_local = index;
  this_local = this;
  std::shared_ptr<libcellml::Component>::shared_ptr
            ((shared_ptr<libcellml::Component> *)this,(nullptr_t)0x0);
  uVar1 = local_20;
  pCVar2 = pFunc((ComponentEntity *)index);
  sVar3 = std::
          vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
          ::size(&pCVar2->mComponents);
  _Var6._M_pi = extraout_RDX;
  if (uVar1 < sVar3) {
    pCVar2 = pFunc((ComponentEntity *)index);
    pvVar4 = std::
             vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
             ::at(&pCVar2->mComponents,local_20);
    std::shared_ptr<libcellml::Component>::operator=
              ((shared_ptr<libcellml::Component> *)this,pvVar4);
    pCVar2 = pFunc((ComponentEntity *)index);
    pCVar5 = pFunc((ComponentEntity *)index);
    local_50._M_current =
         (shared_ptr<libcellml::Component> *)
         std::
         vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
         ::begin(&pCVar5->mComponents);
    local_48 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<libcellml::Component>_*,_std::vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>_>
               ::operator+(&local_50,local_20);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<libcellml::Component>const*,std::vector<std::shared_ptr<libcellml::Component>,std::allocator<std::shared_ptr<libcellml::Component>>>>
    ::__normal_iterator<std::shared_ptr<libcellml::Component>*>
              ((__normal_iterator<std::shared_ptr<libcellml::Component>const*,std::vector<std::shared_ptr<libcellml::Component>,std::allocator<std::shared_ptr<libcellml::Component>>>>
                *)&local_40,&local_48);
    std::
    vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
    ::erase(&pCVar2->mComponents,local_40);
    this_00 = std::
              __shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
    this_01 = Component::pFunc(this_00);
    ParentedEntity::ParentedEntityImpl::removeParent((ParentedEntityImpl *)this_01);
    _Var6._M_pi = extraout_RDX_00;
  }
  CVar7.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  CVar7.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ComponentPtr)CVar7.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ComponentPtr ComponentEntity::takeComponent(size_t index)
{
    ComponentPtr component = nullptr;
    if (index < pFunc()->mComponents.size()) {
        component = pFunc()->mComponents.at(index);
        pFunc()->mComponents.erase(pFunc()->mComponents.begin() + ptrdiff_t(index));
        component->pFunc()->removeParent();
    }

    return component;
}